

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leading_slash.c
# Opt level: O3

void test_leading_slash(void)

{
  wchar_t wVar1;
  char *__haystack;
  char *pcVar2;
  size_t errfile_size;
  size_t local_28;
  
  extract_reference_file("test_leading_slash.tar");
  wVar1 = systemf("%s -xf %s >test.out 2>test.err",testprog,"test_leading_slash.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_leading_slash.c"
                      ,L'\x11',0,"0",(long)wVar1,
                      "systemf(\"%s -xf %s >test.out 2>test.err\", testprog, reffile)",(void *)0x0);
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_leading_slash.c"
             ,L'\x12',"foo/file");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_leading_slash.c"
             ,L'\x13',"foo\n","foo/file");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_leading_slash.c"
             ,L'\x14',"foo\n","foo/hardlink");
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_leading_slash.c"
             ,L'\x15',"foo/file","foo/hardlink");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_leading_slash.c"
             ,L'\x16',"test.out");
  wVar1 = assertion_file_exists
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_leading_slash.c"
                     ,L'\x19',"test.err");
  if (wVar1 != L'\0') {
    __haystack = slurpfile(&local_28,"test.err");
    pcVar2 = strstr(__haystack,"Removing leading \'/\' from member names");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_leading_slash.c"
                     ,L'\x1b',(uint)(pcVar2 != (char *)0x0),
                     "strstr(errfile, expected_errmsg) != NULL",(void *)0x0);
    free(__haystack);
  }
  return;
}

Assistant:

DEFINE_TEST(test_leading_slash)
{
	const char *reffile = "test_leading_slash.tar";
	char *errfile;
	size_t errfile_size;
	const char *expected_errmsg = "Removing leading '/' from member names";

	extract_reference_file(reffile);
	assertEqualInt(0, systemf("%s -xf %s >test.out 2>test.err", testprog, reffile));
	assertFileExists("foo/file");
	assertTextFileContents("foo\x0a", "foo/file");
	assertTextFileContents("foo\x0a", "foo/hardlink");
	assertIsHardlink("foo/file", "foo/hardlink");
	assertEmptyFile("test.out");

	/* Verify the error output contains the expected text somewhere in it */
	if (assertFileExists("test.err")) {
		errfile = slurpfile(&errfile_size, "test.err");
		assert(strstr(errfile, expected_errmsg) != NULL);
		free(errfile);
	}
}